

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O0

Result __thiscall
wabt::WastParser::ParseScript
          (WastParser *this,unique_ptr<wabt::Script,_std::default_delete<wabt::Script>_> *out_script
          )

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  bool bVar1;
  Result result;
  pointer pMVar2;
  pointer pSVar3;
  pointer commands;
  size_type sVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_100;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_db;
  allocator local_da;
  allocator local_d9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  string asStack_b8 [32];
  iterator local_98;
  size_type local_90;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_88;
  Enum local_6c;
  _Type local_68;
  uint local_60;
  Enum local_5c;
  Location local_58;
  unique_ptr<wabt::ModuleCommand,_std::default_delete<wabt::ModuleCommand>_> local_38;
  unique_ptr<wabt::ModuleCommand,_std::default_delete<wabt::ModuleCommand>_> command;
  unique_ptr<wabt::Script,_std::default_delete<wabt::Script>_> local_28;
  unique_ptr<wabt::Script,_std::default_delete<wabt::Script>_> script;
  unique_ptr<wabt::Script,_std::default_delete<wabt::Script>_> *out_script_local;
  WastParser *this_local;
  
  script._M_t.super___uniq_ptr_impl<wabt::Script,_std::default_delete<wabt::Script>_>._M_t.
  super__Tuple_impl<0UL,_wabt::Script_*,_std::default_delete<wabt::Script>_>.
  super__Head_base<0UL,_wabt::Script_*,_false>._M_head_impl =
       (__uniq_ptr_data<wabt::Script,_std::default_delete<wabt::Script>,_true,_true>)
       (__uniq_ptr_data<wabt::Script,_std::default_delete<wabt::Script>,_true,_true>)out_script;
  MakeUnique<wabt::Script>();
  command._M_t.super___uniq_ptr_impl<wabt::ModuleCommand,_std::default_delete<wabt::ModuleCommand>_>
  ._M_t.super__Tuple_impl<0UL,_wabt::ModuleCommand_*,_std::default_delete<wabt::ModuleCommand>_>.
  super__Head_base<0UL,_wabt::ModuleCommand_*,_false>._M_head_impl =
       (__uniq_ptr_data<wabt::ModuleCommand,_std::default_delete<wabt::ModuleCommand>,_true,_true>)
       PeekPair(this);
  bVar1 = anon_unknown_1::IsModuleField
                    ((TokenTypePair)
                     command._M_t.
                     super___uniq_ptr_impl<wabt::ModuleCommand,_std::default_delete<wabt::ModuleCommand>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_wabt::ModuleCommand_*,_std::default_delete<wabt::ModuleCommand>_>
                     .super__Head_base<0UL,_wabt::ModuleCommand_*,_false>._M_head_impl);
  if (bVar1) {
    MakeUnique<wabt::ModuleCommand>();
    GetLocation(&local_58,this);
    pMVar2 = std::unique_ptr<wabt::ModuleCommand,_std::default_delete<wabt::ModuleCommand>_>::
             operator->(&local_38);
    (pMVar2->module).loc.filename.data_ = local_58.filename.data_;
    (pMVar2->module).loc.filename.size_ = local_58.filename.size_;
    (pMVar2->module).loc.field_1.field_1.offset = (size_t)local_58.field_1.field_1.offset;
    *(undefined8 *)((long)&(pMVar2->module).loc.field_1 + 8) = local_58.field_1._8_8_;
    pMVar2 = std::unique_ptr<wabt::ModuleCommand,_std::default_delete<wabt::ModuleCommand>_>::
             operator->(&local_38);
    local_5c = (Enum)ParseModuleFieldList(this,&pMVar2->module);
    bVar1 = Failed((Result)local_5c);
    if (bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Error);
    }
    else {
      pSVar3 = std::unique_ptr<wabt::Script,_std::default_delete<wabt::Script>_>::operator->
                         (&local_28);
      std::
      vector<std::unique_ptr<wabt::Command,std::default_delete<wabt::Command>>,std::allocator<std::unique_ptr<wabt::Command,std::default_delete<wabt::Command>>>>
      ::emplace_back<std::unique_ptr<wabt::ModuleCommand,std::default_delete<wabt::ModuleCommand>>>
                ((vector<std::unique_ptr<wabt::Command,std::default_delete<wabt::Command>>,std::allocator<std::unique_ptr<wabt::Command,std::default_delete<wabt::Command>>>>
                  *)pSVar3,&local_38);
    }
    local_60 = (uint)bVar1;
    std::unique_ptr<wabt::ModuleCommand,_std::default_delete<wabt::ModuleCommand>_>::~unique_ptr
              (&local_38);
    if (local_60 != 0) goto LAB_002a4a7f;
  }
  else {
    local_68 = (_Type)PeekPair(this);
    bVar1 = anon_unknown_1::IsCommand((TokenTypePair)local_68);
    if (bVar1) {
      pSVar3 = std::unique_ptr<wabt::Script,_std::default_delete<wabt::Script>_>::get(&local_28);
      commands = std::unique_ptr<wabt::Script,_std::default_delete<wabt::Script>_>::operator->
                           (&local_28);
      local_6c = (Enum)ParseCommandList(this,pSVar3,&commands->commands);
      bVar1 = Failed((Result)local_6c);
      if (bVar1) {
        Result::Result((Result *)((long)&this_local + 4),Error);
        local_60 = 1;
        goto LAB_002a4a7f;
      }
    }
    else {
      ConsumeIfLpar(this);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_d8,"a module field",&local_d9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(asStack_b8,"a command",&local_da);
      local_98 = &local_d8;
      local_90 = 2;
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      allocator(&local_db);
      __l._M_len = local_90;
      __l._M_array = local_98;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_88,__l,&local_db);
      ErrorExpected(this,&local_88,(char *)0x0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_88);
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~allocator(&local_db);
      local_100 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_98;
      do {
        local_100 = local_100 + -1;
        std::__cxx11::string::~string((string *)local_100);
      } while (local_100 != &local_d8);
      std::allocator<char>::~allocator((allocator<char> *)&local_da);
      std::allocator<char>::~allocator((allocator<char> *)&local_d9);
    }
  }
  result = Expect(this,Eof);
  bVar1 = Failed(result);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
    local_60 = 1;
  }
  else {
    sVar4 = std::vector<wabt::Error,_std::allocator<wabt::Error>_>::size(this->errors_);
    if (sVar4 == 0) {
      std::unique_ptr<wabt::Script,_std::default_delete<wabt::Script>_>::operator=
                ((unique_ptr<wabt::Script,_std::default_delete<wabt::Script>_> *)
                 script._M_t.super___uniq_ptr_impl<wabt::Script,_std::default_delete<wabt::Script>_>
                 ._M_t.super__Tuple_impl<0UL,_wabt::Script_*,_std::default_delete<wabt::Script>_>.
                 super__Head_base<0UL,_wabt::Script_*,_false>._M_head_impl,&local_28);
      Result::Result((Result *)((long)&this_local + 4),Ok);
      local_60 = 1;
    }
    else {
      Result::Result((Result *)((long)&this_local + 4),Error);
      local_60 = 1;
    }
  }
LAB_002a4a7f:
  std::unique_ptr<wabt::Script,_std::default_delete<wabt::Script>_>::~unique_ptr(&local_28);
  return (Result)this_local._4_4_;
}

Assistant:

Result WastParser::ParseScript(std::unique_ptr<Script>* out_script) {
  WABT_TRACE(ParseScript);
  auto script = MakeUnique<Script>();

  // Don't consume the Lpar yet, even though it is required. This way the
  // sub-parser functions (e.g. ParseFuncModuleField) can consume it and keep
  // the parsing structure more regular.
  if (IsModuleField(PeekPair())) {
    // Parse an inline module (i.e. one with no surrounding (module)).
    auto command = MakeUnique<ModuleCommand>();
    command->module.loc = GetLocation();
    CHECK_RESULT(ParseModuleFieldList(&command->module));
    script->commands.emplace_back(std::move(command));
  } else if (IsCommand(PeekPair())) {
    CHECK_RESULT(ParseCommandList(script.get(), &script->commands));
  } else {
    ConsumeIfLpar();
    ErrorExpected({"a module field", "a command"});
  }

  EXPECT(Eof);
  if (errors_->size() == 0) {
    *out_script = std::move(script);
    return Result::Ok;
  } else {
    return Result::Error;
  }
}